

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::VertexArrayTestGroup::init(VertexArrayTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  VertexArrayTestGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  SingleVertexArrayTestGroup::SingleVertexArrayTestGroup
            ((SingleVertexArrayTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultiVertexArrayTestGroup::MultiVertexArrayTestGroup
            ((MultiVertexArrayTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void VertexArrayTestGroup::init (void)
{
	addChild(new SingleVertexArrayTestGroup(m_context));
	addChild(new MultiVertexArrayTestGroup(m_context));
}